

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.h
# Opt level: O0

void __thiscall leveldb::Version::Version(Version *this,VersionSet *vset)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_20;
  VersionSet *vset_local;
  Version *this_local;
  
  this->vset_ = vset;
  this->next_ = this;
  this->prev_ = this;
  this->refs_ = 0;
  local_20 = this->files_;
  do {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector(local_20)
    ;
    local_20 = local_20 + 1;
  } while (local_20 !=
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           &this->file_to_compact_);
  this->file_to_compact_ = (FileMetaData *)0x0;
  this->file_to_compact_level_ = -1;
  this->compaction_score_ = -1.0;
  this->compaction_level_ = -1;
  return;
}

Assistant:

explicit Version(VersionSet* vset)
      : vset_(vset),
        next_(this),
        prev_(this),
        refs_(0),
        file_to_compact_(nullptr),
        file_to_compact_level_(-1),
        compaction_score_(-1),
        compaction_level_(-1) {}